

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O1

string * __thiscall smf::Options::getCommandLine_abi_cxx11_(Options *this)

{
  string *psVar1;
  long lVar2;
  long lVar3;
  
  psVar1 = &this->m_commandString;
  if ((this->m_commandString)._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)psVar1);
    if (1 < this->m_oargc) {
      lVar2 = 1;
      lVar3 = 0x28;
      do {
        std::__cxx11::string::append((char *)psVar1);
        std::__cxx11::string::_M_append
                  ((char *)psVar1,
                   *(ulong *)((long)(this->m_oargv).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar3 + -8));
        lVar2 = lVar2 + 1;
        lVar3 = lVar3 + 0x20;
      } while (lVar2 < this->m_oargc);
    }
  }
  return psVar1;
}

Assistant:

const std::string& Options::getCommandLine(void) {
   if (m_commandString.size()) {
      return m_commandString;
   }

   m_commandString = m_oargv[0];

   int i;
   for (i=1; i<m_oargc; i++) {
      m_commandString += " ";
      m_commandString += m_oargv[i];
   }

   return m_commandString;
}